

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestContext::TestContext(TestContext *this)

{
  TestNetwork *this_00;
  Client *this_01;
  Vat *pVVar1;
  StringPtr name;
  StringPtr name_00;
  Own<capnp::_::TestInterfaceImpl,_std::nullptr_t> OStack_58;
  undefined1 local_48 [24];
  
  kj::EventLoop::EventLoop(&this->loop);
  kj::WaitScope::WaitScope(&this->waitScope,&this->loop);
  (this->network).dumper.schemas.table.rows.builder.ptr = (Entry *)0x0;
  (this->network).dumper.schemas.table.rows.builder.pos =
       (RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *)0x0;
  (this->network).dumper.schemas.table.rows.builder.endPtr = (Entry *)0x0;
  (this->network).dumper.schemas.table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->network).forwardCount = 0;
  (this->network).deniedForwardCount = 0;
  this_00 = &this->network;
  (this->network).map.table.rows.builder.ptr = (Entry *)0x0;
  (this->network).map.table.rows.builder.pos =
       (RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
        *)0x0;
  (this->network).map.table.rows.builder.endPtr = (Entry *)0x0;
  (this->network).dumper.schemas.table.indexes.erasedCount = 0;
  (this->network).dumper.schemas.table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->network).dumper.schemas.table.indexes.buckets.size_ = 0;
  (this->network).dumper.schemas.table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->network).forwardingEnabled = false;
  (this->network).map.table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->network).map.table.indexes.erasedCount = 0;
  (this->network).map.table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->network).map.table.indexes.buckets.size_ = 0;
  (this->network).map.table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (this->network).tokenCounter = 0;
  RpcDumper::addSchema(&this_00->dumper,(InterfaceSchema)0x6598c8);
  RpcDumper::addSchema(&this_00->dumper,(InterfaceSchema)0x65a0a8);
  RpcDumper::addSchema(&this_00->dumper,(InterfaceSchema)0x65a3f8);
  RpcDumper::addSchema(&this_00->dumper,(InterfaceSchema)0x65a9b8);
  RpcDumper::addSchema(&this_00->dumper,(InterfaceSchema)0x65ab48);
  RpcDumper::addSchema(&this_00->dumper,(InterfaceSchema)0x65ace8);
  RpcDumper::addSchema(&this_00->dumper,(InterfaceSchema)0x65b240);
  (this->restorer).callCount = 0;
  (this->restorer).handleCount = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&,int&>
            ((kj *)&OStack_58,&(this->restorer).callCount,&(this->restorer).handleCount);
  this_01 = &(this->restorer).cap;
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            (this_01,&OStack_58);
  kj::Own<capnp::_::TestInterfaceImpl,_std::nullptr_t>::dispose(&OStack_58);
  (this->vats).table.rows.builder.endPtr = (Entry *)0x0;
  (this->vats).table.rows.builder.ptr = (Entry *)0x0;
  (this->vats).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat>_>::Entry>
        *)0x0;
  (this->vats).table.rows.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->vats).table.indexes.erasedCount = 0;
  (this->vats).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->vats).table.indexes.buckets.size_ = 0;
  (this->vats).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  name.content.size_ = 6;
  name.content.ptr = "alice";
  pVVar1 = getVat(this,name);
  this->alice = pVVar1;
  capnproto_test::capnp::test::TestInterface::Client::Client((Client *)local_48,this_01);
  name_00.content.size_ = 4;
  name_00.content.ptr = "bob";
  pVVar1 = initVat<capnproto_test::capnp::test::TestInterface::Client>
                     (this,name_00,(Client *)local_48);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_48 + 8));
  this->bob = pVVar1;
  return;
}

Assistant:

TestContext()
      : waitScope(loop),
        alice(getVat("alice")),
        bob(initVat("bob", restorer.cap)) {}